

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int tableAndColumnIndex(SrcList *pSrc,int N,char *zCol,int *piTab,int *piCol)

{
  int iVar1;
  Table **ppTVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)N;
  if (N < 1) {
    uVar3 = 0;
  }
  ppTVar2 = &pSrc->a[0].pTab;
  uVar4 = 0;
  while( true ) {
    if (uVar3 == uVar4) {
      return 0;
    }
    iVar1 = columnIndex(*ppTVar2,zCol);
    if (-1 < iVar1) break;
    uVar4 = uVar4 + 1;
    ppTVar2 = ppTVar2 + 0xe;
  }
  if (piTab == (int *)0x0) {
    return 1;
  }
  *piTab = (int)uVar4;
  *piCol = iVar1;
  return 1;
}

Assistant:

static int tableAndColumnIndex(
  SrcList *pSrc,       /* Array of tables to search */
  int N,               /* Number of tables in pSrc->a[] to search */
  const char *zCol,    /* Name of the column we are looking for */
  int *piTab,          /* Write index of pSrc->a[] here */
  int *piCol           /* Write index of pSrc->a[*piTab].pTab->aCol[] here */
){
  int i;               /* For looping over tables in pSrc */
  int iCol;            /* Index of column matching zCol */

  assert( (piTab==0)==(piCol==0) );  /* Both or neither are NULL */
  for(i=0; i<N; i++){
    iCol = columnIndex(pSrc->a[i].pTab, zCol);
    if( iCol>=0 ){
      if( piTab ){
        *piTab = i;
        *piCol = iCol;
      }
      return 1;
    }
  }
  return 0;
}